

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::Configuration,_el::Configuration::Predicate>::unregister
          (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this,
          Configuration **ptr)

{
  Configuration *pCVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference ppCVar5;
  const_iterator local_38;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_30;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_28;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_20;
  iterator iter;
  Configuration **ptr_local;
  RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this_local;
  
  if (*ptr != (Configuration *)0x0) {
    iter._M_current = ptr;
    iVar4 = (*(this->
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[5])();
    local_20._M_current = (Configuration **)CONCAT44(extraout_var,iVar4);
    while( true ) {
      iVar4 = (*(this->
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                ).super_ThreadSafe._vptr_ThreadSafe[6])();
      local_28._M_current = (Configuration **)CONCAT44(extraout_var_00,iVar4);
      bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
      if ((!bVar2) ||
         (pCVar1 = *iter._M_current,
         ppCVar5 = __gnu_cxx::
                   __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   ::operator*(&local_20), pCVar1 == *ppCVar5)) break;
      __gnu_cxx::
      __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      ::operator++(&local_20);
    }
    iVar4 = (*(this->
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ).super_ThreadSafe._vptr_ThreadSafe[6])();
    local_30._M_current = (Configuration **)CONCAT44(extraout_var_01,iVar4);
    bVar3 = __gnu_cxx::operator!=(&local_20,&local_30);
    bVar2 = false;
    if (bVar3) {
      ppCVar5 = __gnu_cxx::
                __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                ::operator*(&local_20);
      bVar2 = *ppCVar5 != (Configuration *)0x0;
    }
    if (bVar2) {
      iVar4 = (*(this->
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                ).super_ThreadSafe._vptr_ThreadSafe[0xb])();
      __gnu_cxx::
      __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
      ::__normal_iterator<el::Configuration**>
                ((__normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
                  *)&local_38,&local_20);
      std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::erase
                ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                 CONCAT44(extraout_var_02,iVar4),local_38);
      ppCVar5 = __gnu_cxx::
                __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                ::operator*(&local_20);
      safeDelete<el::Configuration>(ppCVar5);
    }
  }
  return;
}

Assistant:

virtual void unregister(T_Ptr*& ptr) ELPP_FINAL {
    if (ptr) {
      iterator iter = this->begin();
      for (; iter != this->end(); ++iter) {
        if (ptr == *iter) {
          break;
        }
      }
      if (iter != this->end() && *iter != nullptr) {
        this->list().erase(iter);
        base::utils::safeDelete(*iter);
      }
    }
  }